

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHVar1;
  undefined8 uVar2;
  pair<int,_int> pVar3;
  long lVar4;
  int i;
  int iVar5;
  int i_1;
  const_iterator *pcVar6;
  sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  pointer ppVar10;
  byte bVar11;
  size_type old_count;
  pair<google::sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  iterator in_stack_fffffffffffffde8;
  iterator in_stack_fffffffffffffe30;
  pair<int,_int> local_180;
  uint local_174;
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_170;
  HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_168;
  size_type local_160;
  sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_158;
  undefined1 local_110 [80];
  undefined8 local_c0 [9];
  undefined8 local_78 [9];
  
  bVar11 = 0;
  pVar3 = UniqueObjectHelper<std::pair<int,int>>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  ((type *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info + 0xc))->first = pVar3.first;
  *(int *)((long)&(this->
                  super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.key_info + 0x10) = pVar3.second;
  iVar5 = 10;
  do {
    local_158.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)UniqueObjectHelper<std::pair<int,int>>(iVar5);
    google::
    sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert((pair<google::sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_110,this_00,(value_type *)&local_158);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 2000);
  local_170 = &(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ;
  local_160 = *(size_type *)
               ((long)&(this->
                       super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       ).
                       super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.
                       super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.rep.table + 0x38);
  iVar5 = 10;
  local_168 = this;
  do {
    local_174 = 1;
    local_180 = UniqueObjectHelper<std::pair<int,int>>(iVar5);
    local_158.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)google::
                      sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      ::erase(&this_00->rep,&local_180);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_110,"1u","this->ht_.erase(this->UniqueKey(i))",&local_174,
               (unsigned_long *)&local_158);
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_158);
      ppVar10 = (pointer)0xaf1463;
      if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
           *)local_110._8_8_ !=
          (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        ppVar10 = *(pointer *)local_110._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x41f,(char *)ppVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
      if ((pair<int,_int>)local_158.ht != (pair<int,_int>)0x0) {
        (**(code **)(*(long *)local_158.ht + 8))();
      }
    }
    uVar2 = local_110._8_8_;
    if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)local_110._8_8_ !=
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if (*(pointer *)local_110._8_8_ !=
          (pointer)&(((Settings *)(local_110._8_8_ + 8))->
                    super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                    ).super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_
         ) {
        operator_delete(*(pointer *)local_110._8_8_);
      }
      operator_delete((void *)uVar2);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 1000);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin((const_iterator *)local_110,&this_00->rep);
  pHVar1 = local_168;
  this_01 = local_170;
  local_110._72_8_ = local_170;
  pcVar6 = (const_iterator *)local_110;
  puVar8 = local_78;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar8 = pcVar6->ht;
    pcVar6 = (const_iterator *)((long)pcVar6 + (ulong)bVar11 * -0x10 + 8);
    puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
  }
  local_158.pos.row_begin._M_current =
       ((_Vector_impl_data *)
       ((long)&(local_168->
               super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.table + 0x10))->_M_start;
  local_158.pos.row_end._M_current =
       *(pointer *)
        ((long)&(local_168->
                super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x18);
  local_158.pos.col_current = (const_nonempty_iterator)0x0;
  local_158.end.col_current = (const_nonempty_iterator)0x0;
  local_158.ht = &this_00->rep;
  local_158.pos.row_current._M_current = local_158.pos.row_end._M_current;
  local_158.end.row_begin._M_current = local_158.pos.row_begin._M_current;
  local_158.end.row_end._M_current = local_158.pos.row_end._M_current;
  local_158.end.row_current._M_current = local_158.pos.row_end._M_current;
  google::
  sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_158);
  psVar7 = &local_158;
  puVar8 = local_c0;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar8 = psVar7->ht;
    psVar7 = (sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar7 + (ulong)bVar11 * -0x10 + 8);
    puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
  }
  puVar8 = local_78;
  puVar9 = (undefined8 *)&stack0xfffffffffffffde8;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar9 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
  }
  puVar8 = local_c0;
  puVar9 = (undefined8 *)&stack0xfffffffffffffe30;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar9 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
  }
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(this_01,in_stack_fffffffffffffde8,in_stack_fffffffffffffe30);
  local_180 = (pair<int,_int>)((ulong)local_180 & 0xffffffff00000000);
  local_158.ht = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(*(size_type *)
                      ((long)&(pHVar1->
                              super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              ).
                              super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.
                              super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.rep.table + 0x40) -
                    (pHVar1->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_110,"0u","this->ht_.size()",(uint *)&local_180,
             (unsigned_long *)&local_158);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)local_110._8_8_ ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar10 = (pointer)0xaf1463;
    }
    else {
      ppVar10 = *(pointer *)local_110._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x422,(char *)ppVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if (local_158.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_158.ht)->settings).
                             super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                             .super_TransparentHasher.super_Hasher + 8))();
    }
  }
  uVar2 = local_110._8_8_;
  if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)local_110._8_8_ !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if (*(pointer *)local_110._8_8_ !=
        (pointer)&(((Settings *)(local_110._8_8_ + 8))->
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  ).super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_)
    {
      operator_delete(*(pointer *)local_110._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_158.ht = *(sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   **)((long)&(pHVar1->
                              super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              ).
                              super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.
                              super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.rep.table + 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_110,"old_count","this->ht_.bucket_count()",&local_160,
             (unsigned_long *)&local_158);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)local_110._8_8_ ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar10 = (pointer)0xaf1463;
    }
    else {
      ppVar10 = *(pointer *)local_110._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x423,(char *)ppVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if (local_158.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_158.ht)->settings).
                             super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                             .super_TransparentHasher.super_Hasher + 8))();
    }
  }
  if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)local_110._8_8_ !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if (*(pointer *)local_110._8_8_ !=
        (pointer)&(((Settings *)(local_110._8_8_ + 8))->
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  ).super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_)
    {
      operator_delete(*(pointer *)local_110._8_8_);
    }
    operator_delete((void *)local_110._8_8_);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, EraseDoesNotResize) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int i = 10; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  const typename TypeParam::size_type old_count = this->ht_.bucket_count();
  for (int i = 10; i < 1000; i++) {  // erase half one at a time
    EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(i)));
  }
  this->ht_.erase(this->ht_.begin(), this->ht_.end());  // and the rest at once
  EXPECT_EQ(0u, this->ht_.size());
  EXPECT_EQ(old_count, this->ht_.bucket_count());
}